

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string * __thiscall el::base::utils::Str::rtrim(Str *this,string *str)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  lVar2 = *(long *)this;
  lVar4 = *(long *)(this + 8);
  lVar1 = lVar2 + lVar4;
  for (lVar5 = lVar4 >> 2; lVar6 = lVar2 + lVar4, lVar7 = lVar6, 0 < lVar5; lVar5 = lVar5 + -1) {
    local_50 = lVar6;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::$_0>::
            operator()((_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::__0> *)
                       &local_50,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)str);
    if (bVar3) goto LAB_0010dac5;
    lVar7 = lVar2 + lVar4 + -1;
    local_58 = lVar7;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::$_0>::
            operator()((_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::__0> *)
                       &local_58,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)str);
    if (bVar3) goto LAB_0010dac5;
    lVar7 = lVar2 + lVar4 + -2;
    local_60 = lVar7;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::$_0>::
            operator()((_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::__0> *)
                       &local_60,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)str);
    if (bVar3) goto LAB_0010dac5;
    lVar7 = lVar2 + lVar4 + -3;
    local_68 = lVar7;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::$_0>::
            operator()((_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::__0> *)
                       &local_68,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)str);
    if (bVar3) goto LAB_0010dac5;
    lVar4 = lVar4 + -4;
  }
  if (lVar4 == 3) {
    local_38 = lVar6;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::$_0>::
            operator()((_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::__0> *)
                       &local_38,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)str);
    if (bVar3) goto LAB_0010dac5;
    lVar6 = lVar2 + 2;
LAB_0010db00:
    local_40 = lVar6;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::$_0>::
            operator()((_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::__0> *)
                       &local_40,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)str);
    lVar7 = lVar6;
    if (bVar3) goto LAB_0010dac5;
    lVar6 = lVar6 + -1;
  }
  else {
    if (lVar4 == 2) goto LAB_0010db00;
    lVar7 = lVar2;
    if (lVar4 != 1) goto LAB_0010dac5;
  }
  local_48 = lVar6;
  bVar3 = __gnu_cxx::__ops::_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::$_0>::
          operator()((_Iter_pred<el::base::utils::Str::rtrim(std::__cxx11::string&)::__0> *)
                     &local_48,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)str);
  lVar7 = lVar2;
  if (bVar3) {
    lVar7 = lVar6;
  }
LAB_0010dac5:
  ::std::__cxx11::string::erase(this,lVar7,lVar1);
  return (string *)this;
}

Assistant:

Configurations::Configurations(void) :
  m_configurationFile(std::string()),
  m_isFromFile(false) {
}